

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

char * curl_pushheader_byname(curl_pushheaders *h,char *header)

{
  Curl_easy *pCVar1;
  HTTP *pHVar2;
  size_t sVar3;
  int iVar4;
  char *pcVar5;
  size_t __n;
  size_t sVar6;
  
  if ((h != (curl_pushheaders *)0x0) && (pCVar1 = h->data, pCVar1 != (Curl_easy *)0x0)) {
    if (header == (char *)0x0) {
      return (char *)0x0;
    }
    if (pCVar1->magic != 0xc0dedbad) {
      return (char *)0x0;
    }
    if ((*header != '\0') &&
       (((*header != ':' || (header[1] != '\0')) &&
        (pcVar5 = strchr(header + 1,0x3a), pcVar5 == (char *)0x0)))) {
      pHVar2 = (pCVar1->req).p.http;
      __n = strlen(header);
      sVar3 = pHVar2->push_headers_used;
      sVar6 = 0;
      while( true ) {
        if (sVar3 == sVar6) {
          return (char *)0x0;
        }
        pcVar5 = pHVar2->push_headers[sVar6];
        iVar4 = strncmp(header,pcVar5,__n);
        if ((iVar4 == 0) && (pcVar5[__n] == ':')) break;
        sVar6 = sVar6 + 1;
      }
      return pcVar5 + __n + 1;
    }
  }
  return (char *)0x0;
}

Assistant:

char *curl_pushheader_byname(struct curl_pushheaders *h, const char *header)
{
  /* Verify that we got a good easy handle in the push header struct,
     mostly to detect rubbish input fast(er). Also empty header name
     is just a rubbish too. We have to allow ":" at the beginning of
     the header, but header == ":" must be rejected. If we have ':' in
     the middle of header, it could be matched in middle of the value,
     this is because we do prefix match.*/
  if(!h || !GOOD_EASY_HANDLE(h->data) || !header || !header[0] ||
     !strcmp(header, ":") || strchr(header + 1, ':'))
    return NULL;
  else {
    struct HTTP *stream = h->data->req.p.http;
    size_t len = strlen(header);
    size_t i;
    for(i = 0; i<stream->push_headers_used; i++) {
      if(!strncmp(header, stream->push_headers[i], len)) {
        /* sub-match, make sure that it is followed by a colon */
        if(stream->push_headers[i][len] != ':')
          continue;
        return &stream->push_headers[i][len + 1];
      }
    }
  }
  return NULL;
}